

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dequal(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint local_44;
  anon_union_8_4_a234c5df_for_data_ aStack_20;
  bool result;
  DCell d1;
  DCell d2;
  Forth *this_local;
  
  requireDStackDepth(this,4,"D=");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell(&d1,uVar1,uVar2);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,3);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  DCell::DCell((DCell *)&stack0xffffffffffffffe0,uVar1,uVar2);
  ForthStack<unsigned_int>::pop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if ((anon_union_8_4_a234c5df_for_data_)aStack_20.Dcells == d1.data_) {
    local_44 = this->True;
  }
  else {
    local_44 = this->False;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_44);
  return;
}

Assistant:

void dequal(){
			REQUIRE_DSTACK_DEPTH(4, "D=");
			DCell d2(dStack.getTop(1), dStack.getTop());
			DCell d1(dStack.getTop(3), dStack.getTop(2));
			auto result = d1.data_.SDcells==d2.data_.SDcells;
			dStack.pop();dStack.pop();dStack.pop();
			dStack.setTop(0, result? True : False);
		}